

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_PrintClass(Fra_Cla_t *p,Aig_Obj_t **pClass)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  Aig_Obj_t **ppAVar5;
  
  ppAVar5 = pClass + 1;
  do {
    pAVar3 = *ppAVar5;
    if (pAVar3 == (Aig_Obj_t *)0x0) {
      printf("{ ");
      for (; pAVar3 = *pClass, pAVar3 != (Aig_Obj_t *)0x0; pClass = pClass + 1) {
        uVar1 = pAVar3->Id;
        uVar2 = *(uint *)&pAVar3->field_0x1c;
        uVar4 = Aig_SupportSize(p->pAig,pAVar3);
        printf("%d(%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar4);
      }
      puts("}");
      return;
    }
    ppAVar5 = ppAVar5 + 1;
  } while (*(Aig_Obj_t **)
            (*(long *)(*(long *)((long)(pAVar3->field_5).pData + 0x30) + 8) + (long)pAVar3->Id * 8)
           == *pClass);
  __assert_fail("Fra_ClassObjRepr(pTemp) == pClass[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                ,0xda,"void Fra_PrintClass(Fra_Cla_t *, Aig_Obj_t **)");
}

Assistant:

void Fra_PrintClass( Fra_Cla_t * p, Aig_Obj_t ** pClass )
{
    Aig_Obj_t * pTemp;
    int i;
    for ( i = 1; (pTemp = pClass[i]); i++ )
        assert( Fra_ClassObjRepr(pTemp) == pClass[0] );
    printf( "{ " );
    for ( i = 0; (pTemp = pClass[i]); i++ )
        printf( "%d(%d,%d) ", pTemp->Id, pTemp->Level, Aig_SupportSize(p->pAig,pTemp) );
    printf( "}\n" );
}